

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_url(URLGlob **glob,char *url,curl_off_t *urlnum,FILE *error)

{
  URLPattern *pUVar1;
  anon_union_40_3_e2f18bb4_for_content *paVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  FILE *pFVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  URLGlob *glob_00;
  long lVar12;
  char **ppcVar13;
  char *__dest;
  int *piVar14;
  byte *pbVar15;
  ulong uVar16;
  byte *pbVar17;
  ulong uVar18;
  CURLcode CVar19;
  anon_union_40_3_e2f18bb4_for_content *paVar20;
  byte *pbVar21;
  char cVar22;
  int iVar23;
  byte *pbVar24;
  byte *pbVar25;
  char max_c;
  char min_c;
  byte *local_290;
  byte *local_288;
  URLGlob *local_280;
  char end_c;
  long local_270;
  int local_264;
  anon_union_40_3_e2f18bb4_for_content *local_260;
  FILE *local_258;
  long *local_250;
  byte *local_248;
  URLGlob **local_240;
  char hostname [128];
  
  *glob = (URLGlob *)0x0;
  local_258 = error;
  local_250 = urlnum;
  local_248 = (byte *)url;
  sVar10 = strlen(url);
  pcVar11 = (char *)malloc(sVar10 + 1);
  if (pcVar11 != (char *)0x0) {
    *pcVar11 = '\0';
    local_270 = 1;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar10;
      glob_00->glob_buffer = pcVar11;
      pbVar25 = (byte *)0x1;
      CVar19 = CURLE_OK;
      local_264 = 0;
      pbVar24 = local_248;
      local_280 = glob_00;
      local_240 = glob;
LAB_0011c82c:
      if ((CVar19 == CURLE_OK) && (*pbVar24 != 0)) {
        pbVar21 = (byte *)glob_00->glob_buffer;
        sVar10 = 0;
        local_288 = pbVar25;
        do {
          while( true ) {
            bVar7 = *pbVar24;
            if (bVar7 != 0x5b) break;
            pcVar11 = strchr((char *)pbVar24,0x5d);
            if (((pcVar11 == (char *)0x0) ||
                (pcVar11 = pcVar11 + (1 - (long)pbVar24), (char *)0x7f < pcVar11)) ||
               (lVar12 = curl_url(), lVar12 == 0)) {
LAB_0011c8c7:
              pcVar11 = (char *)0x2;
              if (pbVar24[1] != 0x5d) goto LAB_0011c96e;
            }
            else {
              memcpy(hostname,pbVar24,(size_t)pcVar11);
              hostname[(long)pcVar11] = '\0';
              iVar8 = curl_url_set(lVar12,0,hostname,0x200);
              curl_url_cleanup(lVar12);
              if (iVar8 != 0) goto LAB_0011c8c7;
              if (pcVar11 == (char *)0x0) goto LAB_0011c96e;
            }
            memcpy(pbVar21,pbVar24,(size_t)pcVar11);
            pbVar21 = pbVar21 + (long)pcVar11;
            pbVar24 = pbVar24 + (long)pcVar11;
            sVar10 = sVar10 + (long)pcVar11;
          }
          if (0x5c < bVar7) {
            if (bVar7 != 0x5d) {
              if (bVar7 == 0x7b) goto LAB_0011c96e;
              if (bVar7 != 0x7d) goto LAB_0011c955;
            }
            pcVar11 = "unmatched close brace/bracket";
            glob_00 = local_280;
            goto LAB_0011d14a;
          }
          if (bVar7 == 0) goto LAB_0011c96e;
          if (bVar7 == 0x5c) {
            pbVar25 = pbVar24 + 1;
            bVar7 = 0x5c;
            uVar9 = *pbVar25 - 0x5b;
            if ((uVar9 < 0x23) && (bVar7 = 0x5c, (0x500000005U >> ((ulong)uVar9 & 0x3f) & 1) != 0))
            {
              pbVar24 = pbVar24 + 1;
              local_288 = local_288 + 1;
              bVar7 = *pbVar25;
            }
          }
LAB_0011c955:
          pbVar24 = pbVar24 + 1;
          *pbVar21 = bVar7;
          pbVar21 = pbVar21 + 1;
          local_288 = local_288 + 1;
          sVar10 = sVar10 + 1;
        } while( true );
      }
      if (CVar19 == CURLE_OK) {
        *local_250 = local_270;
        *local_240 = glob_00;
        return CURLE_OK;
      }
      goto LAB_0011d167;
    }
    free(pcVar11);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011c96e:
  glob_00 = local_280;
  if (sVar10 != 0) {
    *pbVar21 = 0;
    sVar3 = local_280->size;
    pcVar11 = local_280->glob_buffer;
    local_280->pattern[sVar3].type = UPTSet;
    local_280->pattern[sVar3].globindex = -1;
    local_280->pattern[sVar3].content.Set.size = 1;
    local_280->pattern[sVar3].content.Set.ptr_s = 0;
    ppcVar13 = (char **)malloc(8);
    glob_00->pattern[sVar3].content.Set.elements = ppcVar13;
    if (ppcVar13 == (char **)0x0) {
      glob_00->error = "out of memory";
      glob_00->pos = 0;
      CVar19 = CURLE_OUT_OF_MEMORY;
      pbVar25 = local_288;
    }
    else {
      __dest = (char *)malloc(sVar10 + 1);
      pbVar25 = local_288;
      *ppcVar13 = __dest;
      if (__dest == (char *)0x0) {
        local_280->error = "out of memory";
        local_280->pos = 0;
        CVar19 = CURLE_OUT_OF_MEMORY;
        glob_00 = local_280;
      }
      else {
        memcpy(__dest,pcVar11,sVar10);
        __dest[sVar10] = '\0';
        CVar19 = CURLE_OK;
        glob_00 = local_280;
      }
    }
    goto LAB_0011cf1a;
  }
  CVar19 = CURLE_OK;
  if (*pbVar24 != 0x5b) {
    pbVar25 = local_288;
    if (*pbVar24 == 0x7b) {
      local_290 = pbVar24 + 1;
      sVar3 = local_280->size;
      pbVar21 = (byte *)local_280->glob_buffer;
      local_280->pattern[sVar3].type = UPTSet;
      paVar20 = &local_280->pattern[sVar3].content;
      paVar2 = &local_280->pattern[sVar3].content;
      (paVar2->Set).elements = (char **)0x0;
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->min_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->max_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->ptr_c = '\0';
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->field_0x3 = 0;
      ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar2->Set + 8))->step = 0;
      local_280->pattern[sVar3].content.Set.ptr_s = 0;
      local_280->pattern[sVar3].globindex = local_264;
      local_264 = local_264 + 1;
      lVar12 = 1;
      pbVar15 = local_288;
      local_260 = paVar20;
      do {
        pbVar25 = pbVar15 + 1;
        bVar7 = pbVar24[lVar12];
        if (bVar7 < 0x5c) {
          if (bVar7 != 0x2c) {
            if (bVar7 != 0) {
              if (bVar7 != 0x5b) goto LAB_0011cbd2;
LAB_0011ce67:
              pcVar11 = "nested brace";
              goto LAB_0011cf02;
            }
            local_280->error = "unmatched brace";
            local_280->pos = (size_t)local_288;
            glob_00 = local_280;
            goto LAB_0011cf10;
          }
LAB_0011cb2b:
          *pbVar21 = 0;
          if ((paVar20->Set).elements == (char **)0x0) {
            ppcVar13 = (char **)malloc(8);
            (paVar20->Set).elements = ppcVar13;
            if (ppcVar13 != (char **)0x0) goto LAB_0011cb76;
LAB_0011ce1d:
            local_280->error = "out of memory";
            local_280->pos = 0;
            CVar19 = CURLE_OUT_OF_MEMORY;
            glob_00 = local_280;
            pbVar24 = local_290;
            break;
          }
          ppcVar13 = (char **)realloc((paVar20->Set).elements,
                                      glob_00->pattern[sVar3].content.Set.size * 8 + 8);
          if (ppcVar13 == (char **)0x0) goto LAB_0011ce1d;
          (local_260->Set).elements = ppcVar13;
LAB_0011cb76:
          pcVar11 = strdup(local_280->glob_buffer);
          lVar4 = glob_00->pattern[sVar3].content.Set.size;
          ppcVar13[lVar4] = pcVar11;
          if (pcVar11 == (char *)0x0) goto LAB_0011ce1d;
          glob_00->pattern[sVar3].content.Set.size = lVar4 + 1;
          if (pbVar24[lVar12] == 0x7d) {
            pbVar24 = pbVar24 + lVar12 + 1;
            goto LAB_0011ce7e;
          }
          pbVar21 = (byte *)local_280->glob_buffer;
          paVar20 = local_260;
          pbVar15 = pbVar25;
        }
        else {
          if (bVar7 < 0x7b) {
            if (bVar7 == 0x5c) {
              bVar7 = pbVar24[lVar12 + 1];
              if (bVar7 == 0) {
                bVar7 = 0x5c;
              }
              else {
                lVar12 = lVar12 + 1;
                pbVar25 = pbVar15 + 2;
              }
            }
            else if (bVar7 == 0x5d) goto LAB_0011ceab;
          }
          else {
            if (bVar7 == 0x7d) {
              if (lVar12 != 1) {
                lVar4 = glob_00->pattern[sVar3].content.Set.size;
                if (lVar4 < 0) {
                  local_270 = 0;
                }
                else {
                  bVar5 = local_270 < 1;
                  local_270 = (lVar4 + 1) * local_270;
                  if (bVar5) {
                    local_270 = 0;
                  }
                }
                goto LAB_0011cb2b;
              }
              pcVar11 = "empty string within braces";
              goto LAB_0011cf02;
            }
            if (bVar7 == 0x7b) goto LAB_0011ce67;
          }
LAB_0011cbd2:
          *pbVar21 = bVar7;
          pbVar21 = pbVar21 + 1;
          pbVar15 = pbVar25;
        }
        lVar12 = lVar12 + 1;
      } while( true );
    }
    goto LAB_0011cf1a;
  }
  pbVar21 = pbVar24 + 1;
  pbVar25 = local_288 + 1;
  pUVar1 = local_280->pattern + local_280->size;
  local_280->pattern[local_280->size].globindex = local_264;
  local_264 = local_264 + 1;
  if ((byte)((pbVar24[1] & 0xdf) + 0xbf) < 0x1a) {
    pUVar1->type = UPTCharRange;
    local_290 = pbVar21;
    iVar8 = __isoc99_sscanf(pbVar21,"%c-%c%c",&min_c,&max_c,&end_c);
    if (iVar8 == 3) {
      if (end_c == ']') {
        pbVar24 = pbVar24 + 5;
        pbVar25 = local_288 + 5;
        iVar23 = (int)min_c;
        iVar8 = (int)max_c;
        uVar16 = 1;
        if (min_c == max_c) {
LAB_0011cf68:
          uVar9 = iVar8 - iVar23;
          cVar22 = min_c;
LAB_0011cf6c:
          (pUVar1->content).CharRange.step = (int)uVar16;
          (pUVar1->content).CharRange.min_c = min_c;
          (pUVar1->content).CharRange.ptr_c = min_c;
          (pUVar1->content).CharRange.max_c = cVar22;
          iVar8 = (int)uVar9 / (int)uVar16;
          if (iVar8 < 0) {
            local_270 = 0;
          }
          else {
            bVar5 = local_270 < 1;
            local_270 = (ulong)(iVar8 + 1) * local_270;
            if (bVar5) {
              local_270 = 0;
            }
          }
          CVar19 = CURLE_OK;
          goto LAB_0011cf1a;
        }
LAB_0011cd5e:
        if (min_c <= max_c) {
          uVar9 = iVar8 - iVar23;
          if (((int)uVar9 < 0x1a) && (cVar22 = max_c, uVar16 <= uVar9)) goto LAB_0011cf6c;
        }
      }
      else if (end_c == ':') {
        piVar14 = __errno_location();
        *piVar14 = 0;
        uVar16 = strtoul((char *)(pbVar24 + 5),(char **)hostname,10);
        if ((*piVar14 == 0) && (pbVar24 + 5 != (byte *)hostname._0_8_)) {
          pbVar24 = (byte *)(hostname._0_8_ + 1);
          if (*(char *)hostname._0_8_ != ']') {
            pbVar24 = local_290;
          }
          pbVar25 = pbVar25 + ((long)pbVar24 - (long)local_290);
          if (((*(char *)hostname._0_8_ == ']') && (0xffffffff80000000 < uVar16 - 0x80000000)) &&
             (uVar16 == 1 || min_c != max_c)) {
            iVar23 = (int)min_c;
            iVar8 = (int)max_c;
            if (min_c == max_c) goto LAB_0011cf68;
            goto LAB_0011cd5e;
          }
        }
      }
    }
    glob_00->error = "bad range";
    glob_00->pos = (size_t)pbVar25;
    goto LAB_0011cf10;
  }
  if ((byte)(pbVar24[1] - 0x30) < 10) {
    pUVar1->type = UPTNumRange;
    (pUVar1->content).Set.ptr_s = 0;
    if (*pbVar21 == 0x30) {
      lVar12 = 2;
      do {
        (pUVar1->content).Set.ptr_s = (int)lVar12 + -1;
        pbVar15 = pbVar24 + lVar12;
        lVar12 = lVar12 + 1;
      } while ((byte)(*pbVar15 - 0x30) < 10);
    }
    local_290 = pbVar21;
    piVar14 = __errno_location();
    pbVar21 = local_290;
    *piVar14 = 0;
    pbVar15 = (byte *)strtoul((char *)local_290,(char **)hostname,10);
    pbVar24 = pbVar21;
    if (((*piVar14 == 0) && ((byte *)hostname._0_8_ != pbVar21)) &&
       (pbVar17 = (byte *)hostname._0_8_, *(char *)hostname._0_8_ == '-')) {
      do {
        do {
          pbVar24 = pbVar17 + 1;
          bVar7 = *pbVar24;
          pbVar17 = pbVar24;
        } while (bVar7 == 0x20);
      } while (bVar7 == 9);
      if (9 < (byte)(bVar7 - 0x30)) goto LAB_0011cdf8;
      *piVar14 = 0;
      pbVar17 = (byte *)strtoul((char *)pbVar24,(char **)hostname,10);
      pbVar21 = local_290;
      if (*piVar14 != 0) goto LAB_0011cdf8;
      if (*(char *)hostname._0_8_ != ':') {
        if (*(char *)hostname._0_8_ == ']') {
          pbVar24 = (byte *)(hostname._0_8_ + 1);
          pbVar25 = pbVar25 + ((long)pbVar24 - (long)local_290);
          uVar16 = 1;
          local_288 = pbVar17;
          lVar12 = local_270;
joined_r0x0011d0bc:
          if (local_288 == pbVar15) {
            uVar18 = 0;
          }
          else {
            uVar18 = (long)local_288 - (long)pbVar15;
            pbVar21 = local_290;
            local_270 = lVar12;
            if ((local_288 < pbVar15) || (uVar18 < uVar16)) goto LAB_0011ce01;
          }
          (pUVar1->content).NumRange.min_n = (curl_off_t)pbVar15;
          (pUVar1->content).NumRange.ptr_n = (curl_off_t)pbVar15;
          (pUVar1->content).Set.size = (curl_off_t)local_288;
          (pUVar1->content).NumRange.step = uVar16;
          if ((long)uVar18 / (long)uVar16 < 0) {
            local_270 = 0;
          }
          else {
            local_270 = ((long)uVar18 / (long)uVar16 + 1) * lVar12;
            if (lVar12 < 1) {
              local_270 = 0;
            }
          }
LAB_0011ce7e:
          CVar19 = CURLE_OK;
          glob_00 = local_280;
          goto LAB_0011cf1a;
        }
        goto LAB_0011cdf8;
      }
      pbVar24 = (byte *)(hostname._0_8_ + 1);
      *piVar14 = 0;
      local_288 = pbVar17;
      uVar16 = strtoul((char *)pbVar24,(char **)hostname,10);
      pbVar21 = local_290;
      if (((*piVar14 != 0) || (hostname._0_8_ == 0)) || (*(char *)hostname._0_8_ != ']'))
      goto LAB_0011cdf8;
      pbVar24 = (byte *)(hostname._0_8_ + 1);
      pbVar25 = pbVar25 + ((long)pbVar24 - (long)local_290);
      if ((uVar16 != 0) && (lVar12 = local_270, pbVar15 != local_288 || uVar16 == 1))
      goto joined_r0x0011d0bc;
    }
    else {
LAB_0011cdf8:
      pbVar25 = pbVar24 + ((long)pbVar25 - (long)pbVar21);
    }
LAB_0011ce01:
    local_280->error = "bad range";
    local_280->pos = (size_t)pbVar25;
  }
  else {
    local_280->error = "bad range specification";
    local_280->pos = (size_t)pbVar25;
  }
  CVar19 = CURLE_URL_MALFORMAT;
  glob_00 = local_280;
  pbVar24 = pbVar21;
LAB_0011cf1a:
  uVar16 = glob_00->size + 1;
  glob_00->size = uVar16;
  if (99 < uVar16) {
    pcVar11 = "too many globs";
    local_288 = pbVar25;
LAB_0011d14a:
    glob_00->error = pcVar11;
    glob_00->pos = (size_t)local_288;
    CVar19 = CURLE_URL_MALFORMAT;
LAB_0011d167:
    pFVar6 = local_258;
    if ((local_258 != (FILE *)0x0) && (pcVar11 = glob_00->error, pcVar11 != (char *)0x0)) {
      sVar3 = glob_00->pos;
      if (sVar3 != 0) {
        curl_msnprintf(hostname,0x200,"%s in URL position %zu:\n%s\n%*s^",pcVar11,sVar3,local_248,
                       (int)sVar3 + -1," ");
        pcVar11 = hostname;
      }
      curl_mfprintf(pFVar6,"curl: (%d) %s\n",CVar19,pcVar11);
    }
    glob_cleanup(glob_00);
    *local_250 = 1;
    return CVar19;
  }
  goto LAB_0011c82c;
LAB_0011ceab:
  pcVar11 = "unexpected close bracket";
LAB_0011cf02:
  local_280->error = pcVar11;
  local_280->pos = (size_t)pbVar25;
  glob_00 = local_280;
LAB_0011cf10:
  CVar19 = CURLE_URL_MALFORMAT;
  pbVar24 = local_290;
  goto LAB_0011cf1a;
}

Assistant:

CURLcode glob_url(struct URLGlob **glob, char *url, curl_off_t *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  struct URLGlob *glob_expand;
  curl_off_t amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(struct URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, (int)glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}